

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall wasm::FunctionValidator::visitGlobalGet(FunctionValidator *this,GlobalGet *curr)

{
  bool bVar1;
  Global *pGVar2;
  
  if (this->info->validateGlobally == true) {
    pGVar2 = Module::getGlobalOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->name).super_IString.str);
    bVar1 = ValidationInfo::shouldBeTrue<wasm::GlobalGet*>
                      (this->info,pGVar2 != (Global *)0x0,curr,"global.get name must be valid",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar1) {
      ValidationInfo::shouldBeEqual<wasm::GlobalGet*,wasm::Type>
                (this->info,
                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.
                       type.id,(Type)(pGVar2->type).id,curr,"global.get must have right type",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
      return;
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitGlobalGet(GlobalGet* curr) {
  if (!info.validateGlobally) {
    return;
  }
  auto* global = getModule()->getGlobalOrNull(curr->name);
  if (shouldBeTrue(global, curr, "global.get name must be valid")) {
    shouldBeEqual(
      curr->type, global->type, curr, "global.get must have right type");
  }
}